

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void simple_motion_search_prune_part_features
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int mi_row,int mi_col,
               BLOCK_SIZE bsize,float *features,int features_to_get)

{
  BLOCK_SIZE BVar1;
  int16_t iVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  int in_ECX;
  int iVar6;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  bool bVar7;
  bool bVar8;
  float fVar9;
  long in_stack_00000008;
  uint in_stack_00000010;
  BLOCK_SIZE left_bsize;
  BLOCK_SIZE above_bsize;
  int has_left;
  int has_above;
  int dc_q;
  MACROBLOCKD *xd;
  int sub_idx_2;
  SIMPLE_MOTION_DATA_TREE *sub_tree_1;
  int sub_idx_1;
  int sub_idx;
  int f_idx;
  int sub_mi_row_2;
  int sub_mi_col_2;
  int r_idx_2;
  int sub_mi_row_1;
  int sub_mi_col_1;
  int r_idx_1;
  BLOCK_SIZE subsize_1;
  SIMPLE_MOTION_DATA_TREE *sub_tree;
  int sub_mi_row;
  int sub_mi_col;
  int r_idx;
  BLOCK_SIZE subsize;
  int use_subpixel;
  int num_refs;
  int ref_list [1];
  int h_mi;
  int w_mi;
  undefined1 *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  PARTITION_TYPE in_stack_ffffffffffffff15;
  BLOCK_SIZE in_stack_ffffffffffffff16;
  BLOCK_SIZE in_stack_ffffffffffffff3f;
  int in_stack_ffffffffffffff40;
  byte bVar10;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  MACROBLOCK *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_78;
  int local_6c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar11;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar12;
  long in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  undefined4 uVar13;
  undefined4 uVar14;
  
  uVar3 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R9B]
  ;
  uVar4 = 1;
  if (*(int *)(in_RDI + 0x607a8) != 0) {
    uVar4 = 7;
  }
  uVar14 = 1;
  uVar13 = 1;
  if ((*(int *)(in_RDX + 0x70) == 0) && ((in_stack_00000010 & 1) != 0)) {
    in_stack_ffffffffffffff08 = &stack0xffffffffffffffc8;
    in_stack_ffffffffffffff10 = 1;
    simple_motion_search_get_best_ref
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,
               (SIMPLE_MOTION_DATA_TREE *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68,
               (BLOCK_SIZE)((uint)in_stack_ffffffffffffff64 >> 0x18),
               (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
               (uint *)0x100000001,
               (uint *)(ulong)CONCAT14("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                       [in_R9B],uVar4));
    *(undefined4 *)(in_RDX + 0x70) = 1;
  }
  if ((in_stack_00000010 & 2) != 0) {
    get_partition_subsize(in_stack_ffffffffffffff16,in_stack_ffffffffffffff15);
    for (in_stack_ffffffffffffffb8 = 0; in_stack_ffffffffffffffb8 < 4;
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
      in_stack_ffffffffffffffb0 = in_ECX + (int)((in_stack_ffffffffffffffb8 >> 1) * uVar3) / 2;
      in_stack_ffffffffffffffa8 = *(long *)(in_RDX + 8 + (long)in_stack_ffffffffffffffb8 * 8);
      in_stack_ffffffffffffff50 = in_R8D;
      in_stack_ffffffffffffff54 = in_ECX;
      if (*(int *)(in_stack_ffffffffffffffa8 + 0x70) == 0) {
        in_stack_ffffffffffffff08 = &stack0xffffffffffffffc8;
        in_stack_ffffffffffffff10 = 1;
        simple_motion_search_get_best_ref
                  ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78,
                   (SIMPLE_MOTION_DATA_TREE *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68,
                   (BLOCK_SIZE)((uint)in_stack_ffffffffffffff64 >> 0x18),
                   (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffb8,(uint *)CONCAT44(uVar14,uVar13),
                   (uint *)CONCAT44(uVar3,uVar4));
        *(undefined4 *)(in_stack_ffffffffffffffa8 + 0x70) = 1;
      }
    }
  }
  if ((*(int *)(in_RDX + 0x74) == 0) && ((in_stack_00000010 & 4) != 0)) {
    BVar1 = get_partition_subsize(in_stack_ffffffffffffff16,in_stack_ffffffffffffff15);
    uVar12 = CONCAT13(BVar1,(int3)in_stack_ffffffffffffffa4);
    for (iVar11 = 0; iVar11 < 2; iVar11 = iVar11 + 1) {
      in_stack_ffffffffffffff08 = &stack0xffffffffffffffc8;
      in_stack_ffffffffffffff10 = 1;
      in_stack_ffffffffffffff4c = in_ECX;
      simple_motion_search_get_best_ref
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,
                 (SIMPLE_MOTION_DATA_TREE *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68,
                 (BLOCK_SIZE)((uint)in_stack_ffffffffffffff64 >> 0x18),
                 (int *)CONCAT44(uVar12,iVar11),(int)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,(uint *)CONCAT44(uVar14,uVar13)
                 ,(uint *)CONCAT44(uVar3,uVar4));
    }
    BVar1 = get_partition_subsize(in_stack_ffffffffffffff16,in_stack_ffffffffffffff15);
    uVar12 = CONCAT13(BVar1,(int3)uVar12);
    for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
      in_stack_ffffffffffffff08 = &stack0xffffffffffffffc8;
      in_stack_ffffffffffffff10 = 1;
      in_stack_ffffffffffffff48 = in_R8D;
      simple_motion_search_get_best_ref
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,
                 (SIMPLE_MOTION_DATA_TREE *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68,
                 (BLOCK_SIZE)((uint)in_stack_ffffffffffffff64 >> 0x18),
                 (int *)CONCAT44(uVar12,iVar11),(int)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,(uint *)CONCAT44(uVar14,uVar13)
                 ,(uint *)CONCAT44(uVar3,uVar4));
    }
    *(undefined4 *)(in_RDX + 0x74) = 1;
  }
  if (in_stack_00000008 != 0) {
    local_78 = 0;
    if ((in_stack_00000010 & 1) != 0) {
      for (iVar11 = 0; iVar11 < 2; iVar11 = iVar11 + 1) {
        fVar9 = log1pf((float)*(uint *)(in_RDX + 0x48 + (long)iVar11 * 4));
        *(float *)(in_stack_00000008 + (long)local_78 * 4) = fVar9;
        local_78 = local_78 + 1;
      }
    }
    if ((in_stack_00000010 & 2) != 0) {
      for (iVar11 = 0; iVar11 < 4; iVar11 = iVar11 + 1) {
        lVar5 = *(long *)(in_RDX + 8 + (long)iVar11 * 8);
        fVar9 = log1pf((float)*(uint *)(lVar5 + 0x48));
        iVar6 = local_78 + 1;
        *(float *)(in_stack_00000008 + (long)local_78 * 4) = fVar9;
        fVar9 = log1pf((float)*(uint *)(lVar5 + 0x4c));
        local_78 = local_78 + 2;
        *(float *)(in_stack_00000008 + (long)iVar6 * 4) = fVar9;
      }
    }
    if ((in_stack_00000010 & 4) != 0) {
      for (iVar11 = 0; iVar11 < 8; iVar11 = iVar11 + 1) {
        fVar9 = log1pf((float)*(uint *)(in_RDX + 0x50 + (long)iVar11 * 4));
        *(float *)(in_stack_00000008 + (long)local_78 * 4) = fVar9;
        local_78 = local_78 + 1;
      }
    }
    lVar5 = in_RSI + 0x1a0;
    set_offsets_for_motion_search
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
    iVar2 = av1_dc_quant_QTX(in_stack_ffffffffffffff10,
                             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                             (aom_bit_depth_t)in_stack_ffffffffffffff08);
    iVar11 = (int)iVar2 >> ((char)*(undefined4 *)(lVar5 + 0x29a0) - 8U & 0x1f);
    fVar9 = log1pf((float)(iVar11 * iVar11) / 256.0);
    *(float *)(in_stack_00000008 + (long)local_78 * 4) = fVar9;
    bVar7 = *(long *)(lVar5 + 0x1ed0) != 0;
    bVar8 = *(long *)(lVar5 + 0x1ec8) != 0;
    bVar10 = in_R9B;
    if (bVar7) {
      bVar10 = **(byte **)(lVar5 + 0x1ed0);
    }
    if (bVar8) {
      in_R9B = **(byte **)(lVar5 + 0x1ec8);
    }
    *(float *)(in_stack_00000008 + (long)(local_78 + 1) * 4) = (float)bVar7;
    *(float *)(in_stack_00000008 + (long)(local_78 + 2) * 4) = (float)""[bVar10];
    *(float *)(in_stack_00000008 + (long)(local_78 + 3) * 4) = (float)""[bVar10];
    *(float *)(in_stack_00000008 + (long)(local_78 + 4) * 4) = (float)bVar8;
    *(float *)(in_stack_00000008 + (long)(local_78 + 5) * 4) = (float)""[in_R9B];
    *(float *)(in_stack_00000008 + (long)(local_78 + 6) * 4) = (float)""[in_R9B];
  }
  return;
}

Assistant:

static inline void simple_motion_search_prune_part_features(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    int mi_row, int mi_col, BLOCK_SIZE bsize, float *features,
    int features_to_get) {
  const int w_mi = mi_size_wide[bsize];
  const int h_mi = mi_size_high[bsize];
  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  assert(bsize >= BLOCK_8X8);
  assert(cpi->ref_frame_flags & av1_ref_frame_flag_list[LAST_FRAME] ||
         cpi->ref_frame_flags & av1_ref_frame_flag_list[ALTREF_FRAME]);

  // Setting up motion search
  const int ref_list[] = { cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME
                                                        : LAST_FRAME };
  const int num_refs = 1;
  const int use_subpixel = 1;

  // Doing whole block first to update the mv
  if (!sms_tree->sms_none_valid && features_to_get & FEATURE_SMS_NONE_FLAG) {
    simple_motion_search_get_best_ref(cpi, x, sms_tree, mi_row, mi_col, bsize,
                                      ref_list, num_refs, use_subpixel, 1,
                                      &sms_tree->sms_none_feat[0],
                                      &sms_tree->sms_none_feat[1]);
    sms_tree->sms_none_valid = 1;
  }

  // Split subblocks
  if (features_to_get & FEATURE_SMS_SPLIT_FLAG) {
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_SPLIT; r_idx++) {
      const int sub_mi_col = mi_col + (r_idx & 1) * w_mi / 2;
      const int sub_mi_row = mi_row + (r_idx >> 1) * h_mi / 2;
      SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[r_idx];

      if (!sub_tree->sms_none_valid) {
        simple_motion_search_get_best_ref(
            cpi, x, sub_tree, sub_mi_row, sub_mi_col, subsize, ref_list,
            num_refs, use_subpixel, 1, &sub_tree->sms_none_feat[0],
            &sub_tree->sms_none_feat[1]);
        sub_tree->sms_none_valid = 1;
      }
    }
  }

  // Rectangular subblocks
  if (!sms_tree->sms_rect_valid && features_to_get & FEATURE_SMS_RECT_FLAG) {
    // Horz subblock
    BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_HORZ);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_RECT; r_idx++) {
      const int sub_mi_col = mi_col + 0;
      const int sub_mi_row = mi_row + r_idx * h_mi / 2;

      simple_motion_search_get_best_ref(
          cpi, x, sms_tree, sub_mi_row, sub_mi_col, subsize, ref_list, num_refs,
          use_subpixel, 0, &sms_tree->sms_rect_feat[2 * r_idx],
          &sms_tree->sms_rect_feat[2 * r_idx + 1]);
    }

    // Vert subblock
    subsize = get_partition_subsize(bsize, PARTITION_VERT);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_RECT; r_idx++) {
      const int sub_mi_col = mi_col + r_idx * w_mi / 2;
      const int sub_mi_row = mi_row + 0;

      simple_motion_search_get_best_ref(
          cpi, x, sms_tree, sub_mi_row, sub_mi_col, subsize, ref_list, num_refs,
          use_subpixel, 0, &sms_tree->sms_rect_feat[4 + 2 * r_idx],
          &sms_tree->sms_rect_feat[4 + 2 * r_idx + 1]);
    }
    sms_tree->sms_rect_valid = 1;
  }

  if (!features) return;

  int f_idx = 0;
  if (features_to_get & FEATURE_SMS_NONE_FLAG) {
    for (int sub_idx = 0; sub_idx < 2; sub_idx++) {
      features[f_idx++] = log1pf((float)sms_tree->sms_none_feat[sub_idx]);
    }
  }

  if (features_to_get & FEATURE_SMS_SPLIT_FLAG) {
    for (int sub_idx = 0; sub_idx < SUB_PARTITIONS_SPLIT; sub_idx++) {
      SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[sub_idx];
      features[f_idx++] = log1pf((float)sub_tree->sms_none_feat[0]);
      features[f_idx++] = log1pf((float)sub_tree->sms_none_feat[1]);
    }
  }

  if (features_to_get & FEATURE_SMS_RECT_FLAG) {
    for (int sub_idx = 0; sub_idx < 8; sub_idx++) {
      features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[sub_idx]);
    }
  }

  const MACROBLOCKD *xd = &x->e_mbd;
  set_offsets_for_motion_search(cpi, x, mi_row, mi_col, bsize);

  // Q_INDEX
  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  features[f_idx++] = log1pf((float)(dc_q * dc_q) / 256.0f);

  // Neighbor stuff
  const int has_above = !!xd->above_mbmi;
  const int has_left = !!xd->left_mbmi;
  const BLOCK_SIZE above_bsize = has_above ? xd->above_mbmi->bsize : bsize;
  const BLOCK_SIZE left_bsize = has_left ? xd->left_mbmi->bsize : bsize;
  features[f_idx++] = (float)has_above;
  features[f_idx++] = (float)mi_size_wide_log2[above_bsize];
  features[f_idx++] = (float)mi_size_high_log2[above_bsize];
  features[f_idx++] = (float)has_left;
  features[f_idx++] = (float)mi_size_wide_log2[left_bsize];
  features[f_idx++] = (float)mi_size_high_log2[left_bsize];
}